

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatterBase.c
# Opt level: O0

ZyanStatus
ZydisFormatterBasePrintDecorator
          (ZydisFormatter *formatter,ZydisFormatterBuffer *buffer,ZydisFormatterContext *context,
          ZydisDecorator decorator)

{
  ZyanStatus ZVar1;
  uint uVar2;
  ZyanStatus status_047620348_71;
  ZyanStatus status_047620348_70;
  ZyanStatus status_047620348_69;
  ZyanStatus status_047620348_68;
  ZyanStatus status_047620348_67;
  ZyanStatus status_047620348_66;
  ZyanStatus status_047620348_65;
  ZyanStatus status_047620348_64;
  ZyanStatus status_047620348_63;
  ZyanStatus status_047620348_62;
  ZyanStatus status_047620348_61;
  ZyanStatus status_047620348_60;
  ZyanStatus status_047620348_59;
  ZyanStatus status_047620348_58;
  ZyanStatus status_047620348_57;
  ZyanStatus status_047620348_56;
  ZyanStatus status_047620348_55;
  ZyanStatus status_047620348_54;
  ZyanStatus status_047620348_53;
  ZyanStatus status_047620348_52;
  ZyanStatus status_047620348_51;
  ZyanStatus status_047620348_50;
  ZyanStatus status_047620348_49;
  ZyanStatus status_047620348_48;
  ZyanStatus status_047620348_47;
  ZyanStatus status_047620348_46;
  ZyanStatus status_047620348_45;
  ZyanStatus status_047620348_44;
  ZyanStatus status_047620348_43;
  ZyanStatus status_047620348_42;
  ZyanStatus status_047620348_41;
  ZyanStatus status_047620348_40;
  ZyanStatus status_047620348_39;
  ZyanStatus status_047620348_38;
  ZyanStatus status_047620348_37;
  ZyanStatus status_047620348_36;
  ZyanStatus status_047620348_35;
  ZyanStatus status_047620348_34;
  ZyanStatus status_047620348_33;
  ZyanStatus status_047620348_32;
  ZyanStatus status_047620348_31;
  ZyanStatus status_047620348_30;
  ZyanStatus status_047620348_29;
  ZyanStatus status_047620348_28;
  ZyanStatus status_047620348_27;
  ZyanStatus status_047620348_26;
  ZyanStatus status_047620348_25;
  ZyanStatus status_047620348_24;
  ZyanStatus status_047620348_23;
  ZyanStatus status_047620348_22;
  ZyanStatus status_047620348_21;
  ZyanStatus status_047620348_20;
  ZyanStatus status_047620348_19;
  ZyanStatus status_047620348_18;
  ZyanStatus status_047620348_17;
  ZyanStatus status_047620348_16;
  ZyanStatus status_047620348_15;
  ZyanStatus status_047620348_14;
  ZyanStatus status_047620348_13;
  ZyanStatus status_047620348_12;
  ZyanStatus status_047620348_11;
  ZyanStatus status_047620348_10;
  ZyanStatus status_047620348_9;
  ZyanStatus status_047620348_8;
  ZyanStatus status_047620348_7;
  ZyanStatus status_047620348_6;
  ZyanStatus status_047620348_5;
  ZyanStatus status_047620348_4;
  ZyanStatus status_047620348_3;
  ZyanStatus status_047620348_2;
  ZyanStatus status_047620348_1;
  ZyanStatus status_047620348;
  ZydisDecorator decorator_local;
  ZydisFormatterContext *context_local;
  ZydisFormatterBuffer *buffer_local;
  ZydisFormatter *formatter_local;
  
  if (formatter == (ZydisFormatter *)0x0) {
    __assert_fail("formatter",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterBase.c"
                  ,0x24a,
                  "ZyanStatus ZydisFormatterBasePrintDecorator(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *, ZydisDecorator)"
                 );
  }
  if (buffer == (ZydisFormatterBuffer *)0x0) {
    __assert_fail("buffer",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterBase.c"
                  ,0x24b,
                  "ZyanStatus ZydisFormatterBasePrintDecorator(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *, ZydisDecorator)"
                 );
  }
  if (context == (ZydisFormatterContext *)0x0) {
    __assert_fail("context",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterBase.c"
                  ,0x24c,
                  "ZyanStatus ZydisFormatterBasePrintDecorator(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *, ZydisDecorator)"
                 );
  }
  switch(decorator) {
  case ZYDIS_DECORATOR_MASK:
    if ((context->instruction->avx).mask.reg == ZYDIS_REGISTER_K0) {
      return 0x100000;
    }
    if (buffer->is_token_list == '\0') {
      ZVar1 = ZydisStringAppendShort(&buffer->string,&STR_DECO_BEGIN);
      if ((ZVar1 & 0x80000000) != 0) {
        return ZVar1;
      }
      ZVar1 = (*formatter->func_print_register)
                        (formatter,buffer,context,(context->instruction->avx).mask.reg);
      if ((ZVar1 & 0x80000000) != 0) {
        return ZVar1;
      }
      uVar2 = ZydisStringAppendShort(&buffer->string,&STR_DECO_END);
    }
    else {
      if (buffer->is_token_list == '\0') {
        uVar2 = ZydisStringAppendShort(&buffer->string,&STR_DECO_BEGIN);
      }
      else {
        uVar2 = ZydisFormatterBufferAppendPredefined
                          (buffer,(ZydisPredefinedToken *)&TOK_DATA_DECO_BEGIN);
      }
      if ((uVar2 & 0x80000000) != 0) {
        return uVar2;
      }
      ZVar1 = (*formatter->func_print_register)
                        (formatter,buffer,context,(context->instruction->avx).mask.reg);
      if ((ZVar1 & 0x80000000) != 0) {
        return ZVar1;
      }
      if (buffer->is_token_list == '\0') {
        uVar2 = ZydisStringAppendShort(&buffer->string,&STR_DECO_END);
      }
      else {
        uVar2 = ZydisFormatterBufferAppendPredefined
                          (buffer,(ZydisPredefinedToken *)&TOK_DATA_DECO_END);
      }
    }
    if ((uVar2 & 0x80000000) != 0) {
      return uVar2;
    }
    if (((context->instruction->avx).mask.mode != ZYDIS_MASK_MODE_REQUIRED_BITS) &&
       ((context->instruction->avx).mask.mode != ZYDIS_MASK_MODE_CONTROL_ZEROING)) {
      return 0x100000;
    }
    if ((context->instruction->raw).field_3.xop.offset == '\0') {
      return 0x100000;
    }
    if (buffer->is_token_list == '\0') {
      uVar2 = ZydisStringAppendShortCase(&buffer->string,&STR_DECO_ZERO,formatter->case_decorators);
    }
    else {
      uVar2 = ZydisFormatterBufferAppendPredefined
                        (buffer,(ZydisPredefinedToken *)&TOK_DATA_DECO_ZERO);
    }
    break;
  case ZYDIS_DECORATOR_BC:
    if ((context->instruction->avx).broadcast.is_static != '\0') {
      return 0x100000;
    }
    switch((context->instruction->avx).broadcast.mode) {
    case ZYDIS_BROADCAST_MODE_INVALID:
      return 0x100000;
    case ZYDIS_BROADCAST_MODE_1_TO_2:
      if (buffer->is_token_list == '\0') {
        uVar2 = ZydisStringAppendShortCase
                          (&buffer->string,&STR_DECO_1TO2,formatter->case_decorators);
      }
      else {
        uVar2 = ZydisFormatterBufferAppendPredefined
                          (buffer,(ZydisPredefinedToken *)&TOK_DATA_DECO_1TO2);
      }
      break;
    case ZYDIS_BROADCAST_MODE_1_TO_4:
      if (buffer->is_token_list == '\0') {
        uVar2 = ZydisStringAppendShortCase
                          (&buffer->string,&STR_DECO_1TO4,formatter->case_decorators);
      }
      else {
        uVar2 = ZydisFormatterBufferAppendPredefined
                          (buffer,(ZydisPredefinedToken *)&TOK_DATA_DECO_1TO4);
      }
      break;
    case ZYDIS_BROADCAST_MODE_1_TO_8:
      if (buffer->is_token_list == '\0') {
        uVar2 = ZydisStringAppendShortCase
                          (&buffer->string,&STR_DECO_1TO8,formatter->case_decorators);
      }
      else {
        uVar2 = ZydisFormatterBufferAppendPredefined
                          (buffer,(ZydisPredefinedToken *)&TOK_DATA_DECO_1TO8);
      }
      break;
    case ZYDIS_BROADCAST_MODE_1_TO_16:
      if (buffer->is_token_list == '\0') {
        uVar2 = ZydisStringAppendShortCase
                          (&buffer->string,&STR_DECO_1TO16,formatter->case_decorators);
      }
      else {
        uVar2 = ZydisFormatterBufferAppendPredefined
                          (buffer,(ZydisPredefinedToken *)&TOK_DATA_DECO_1TO16);
      }
      break;
    case ZYDIS_BROADCAST_MODE_1_TO_32:
      if (buffer->is_token_list == '\0') {
        uVar2 = ZydisStringAppendShortCase
                          (&buffer->string,&STR_DECO_1TO32,formatter->case_decorators);
      }
      else {
        uVar2 = ZydisFormatterBufferAppendPredefined
                          (buffer,(ZydisPredefinedToken *)&TOK_DATA_DECO_1TO32);
      }
      break;
    case ZYDIS_BROADCAST_MODE_1_TO_64:
      if (buffer->is_token_list == '\0') {
        uVar2 = ZydisStringAppendShortCase
                          (&buffer->string,&STR_DECO_1TO64,formatter->case_decorators);
      }
      else {
        uVar2 = ZydisFormatterBufferAppendPredefined
                          (buffer,(ZydisPredefinedToken *)&TOK_DATA_DECO_1TO64);
      }
      break;
    default:
      return 0x80100004;
    case ZYDIS_BROADCAST_MODE_4_TO_8:
      if (buffer->is_token_list == '\0') {
        uVar2 = ZydisStringAppendShortCase
                          (&buffer->string,&STR_DECO_4TO8,formatter->case_decorators);
      }
      else {
        uVar2 = ZydisFormatterBufferAppendPredefined
                          (buffer,(ZydisPredefinedToken *)&TOK_DATA_DECO_4TO8);
      }
      break;
    case ZYDIS_BROADCAST_MODE_4_TO_16:
      if (buffer->is_token_list == '\0') {
        uVar2 = ZydisStringAppendShortCase
                          (&buffer->string,&STR_DECO_4TO16,formatter->case_decorators);
      }
      else {
        uVar2 = ZydisFormatterBufferAppendPredefined
                          (buffer,(ZydisPredefinedToken *)&TOK_DATA_DECO_4TO16);
      }
      break;
    case ZYDIS_BROADCAST_MODE_8_TO_16:
      if (buffer->is_token_list == '\0') {
        uVar2 = ZydisStringAppendShortCase
                          (&buffer->string,&STR_DECO_8TO16,formatter->case_decorators);
      }
      else {
        uVar2 = ZydisFormatterBufferAppendPredefined
                          (buffer,(ZydisPredefinedToken *)&TOK_DATA_DECO_8TO16);
      }
    }
    break;
  case ZYDIS_DECORATOR_RC:
    if ((context->instruction->avx).has_sae == '\0') {
      switch((context->instruction->avx).rounding.mode) {
      case ZYDIS_ROUNDING_MODE_INVALID:
        return 0x100000;
      case ZYDIS_ROUNDING_MODE_RN:
        if (buffer->is_token_list == '\0') {
          uVar2 = ZydisStringAppendShortCase
                            (&buffer->string,&STR_DECO_RN,formatter->case_decorators);
        }
        else {
          uVar2 = ZydisFormatterBufferAppendPredefined
                            (buffer,(ZydisPredefinedToken *)&TOK_DATA_DECO_RN);
        }
        break;
      case ZYDIS_ROUNDING_MODE_RD:
        if (buffer->is_token_list == '\0') {
          uVar2 = ZydisStringAppendShortCase
                            (&buffer->string,&STR_DECO_RD,formatter->case_decorators);
        }
        else {
          uVar2 = ZydisFormatterBufferAppendPredefined
                            (buffer,(ZydisPredefinedToken *)&TOK_DATA_DECO_RD);
        }
        break;
      case ZYDIS_ROUNDING_MODE_REQUIRED_BITS:
        if (buffer->is_token_list == '\0') {
          uVar2 = ZydisStringAppendShortCase
                            (&buffer->string,&STR_DECO_RU,formatter->case_decorators);
        }
        else {
          uVar2 = ZydisFormatterBufferAppendPredefined
                            (buffer,(ZydisPredefinedToken *)&TOK_DATA_DECO_RU);
        }
        break;
      case ZYDIS_ROUNDING_MODE_MAX_VALUE:
        if (buffer->is_token_list == '\0') {
          uVar2 = ZydisStringAppendShortCase
                            (&buffer->string,&STR_DECO_RZ,formatter->case_decorators);
        }
        else {
          uVar2 = ZydisFormatterBufferAppendPredefined
                            (buffer,(ZydisPredefinedToken *)&TOK_DATA_DECO_RZ);
        }
        break;
      default:
        return 0x80100004;
      }
    }
    else {
      switch((context->instruction->avx).rounding.mode) {
      case ZYDIS_ROUNDING_MODE_INVALID:
        return 0x100000;
      case ZYDIS_ROUNDING_MODE_RN:
        if (buffer->is_token_list == '\0') {
          uVar2 = ZydisStringAppendShortCase
                            (&buffer->string,&STR_DECO_RN_SAE,formatter->case_decorators);
        }
        else {
          uVar2 = ZydisFormatterBufferAppendPredefined
                            (buffer,(ZydisPredefinedToken *)&TOK_DATA_DECO_RN_SAE);
        }
        break;
      case ZYDIS_ROUNDING_MODE_RD:
        if (buffer->is_token_list == '\0') {
          uVar2 = ZydisStringAppendShortCase
                            (&buffer->string,&STR_DECO_RD_SAE,formatter->case_decorators);
        }
        else {
          uVar2 = ZydisFormatterBufferAppendPredefined
                            (buffer,(ZydisPredefinedToken *)&TOK_DATA_DECO_RD_SAE);
        }
        break;
      case ZYDIS_ROUNDING_MODE_REQUIRED_BITS:
        if (buffer->is_token_list == '\0') {
          uVar2 = ZydisStringAppendShortCase
                            (&buffer->string,&STR_DECO_RU_SAE,formatter->case_decorators);
        }
        else {
          uVar2 = ZydisFormatterBufferAppendPredefined
                            (buffer,(ZydisPredefinedToken *)&TOK_DATA_DECO_RU_SAE);
        }
        break;
      case ZYDIS_ROUNDING_MODE_MAX_VALUE:
        if (buffer->is_token_list == '\0') {
          uVar2 = ZydisStringAppendShortCase
                            (&buffer->string,&STR_DECO_RZ_SAE,formatter->case_decorators);
        }
        else {
          uVar2 = ZydisFormatterBufferAppendPredefined
                            (buffer,(ZydisPredefinedToken *)&TOK_DATA_DECO_RZ_SAE);
        }
        break;
      default:
        return 0x80100004;
      }
    }
    break;
  case ZYDIS_DECORATOR_SAE:
    if ((context->instruction->avx).has_sae == '\0') {
      return 0x100000;
    }
    if ((context->instruction->avx).rounding.mode != ZYDIS_ROUNDING_MODE_INVALID) {
      return 0x100000;
    }
    if (buffer->is_token_list == '\0') {
      uVar2 = ZydisStringAppendShortCase(&buffer->string,&STR_DECO_SAE,formatter->case_decorators);
    }
    else {
      uVar2 = ZydisFormatterBufferAppendPredefined
                        (buffer,(ZydisPredefinedToken *)&TOK_DATA_DECO_SAE);
    }
    break;
  case ZYDIS_DECORATOR_SWIZZLE:
    switch((context->instruction->avx).swizzle.mode) {
    case ZYDIS_SWIZZLE_MODE_INVALID:
    case ZYDIS_SWIZZLE_MODE_DCBA:
      return 0x100000;
    case ZYDIS_SWIZZLE_MODE_CDAB:
      if (buffer->is_token_list == '\0') {
        uVar2 = ZydisStringAppendShortCase
                          (&buffer->string,&STR_DECO_CDAB,formatter->case_decorators);
      }
      else {
        uVar2 = ZydisFormatterBufferAppendPredefined
                          (buffer,(ZydisPredefinedToken *)&TOK_DATA_DECO_CDAB);
      }
      break;
    case ZYDIS_SWIZZLE_MODE_BADC:
      if (buffer->is_token_list == '\0') {
        uVar2 = ZydisStringAppendShortCase
                          (&buffer->string,&STR_DECO_BADC,formatter->case_decorators);
      }
      else {
        uVar2 = ZydisFormatterBufferAppendPredefined
                          (buffer,(ZydisPredefinedToken *)&TOK_DATA_DECO_BADC);
      }
      break;
    case ZYDIS_SWIZZLE_MODE_DACB:
      if (buffer->is_token_list == '\0') {
        uVar2 = ZydisStringAppendShortCase
                          (&buffer->string,&STR_DECO_DACB,formatter->case_decorators);
      }
      else {
        uVar2 = ZydisFormatterBufferAppendPredefined
                          (buffer,(ZydisPredefinedToken *)&TOK_DATA_DECO_DACB);
      }
      break;
    case ZYDIS_SWIZZLE_MODE_AAAA:
      if (buffer->is_token_list == '\0') {
        uVar2 = ZydisStringAppendShortCase
                          (&buffer->string,&STR_DECO_AAAA,formatter->case_decorators);
      }
      else {
        uVar2 = ZydisFormatterBufferAppendPredefined
                          (buffer,(ZydisPredefinedToken *)&TOK_DATA_DECO_AAAA);
      }
      break;
    case ZYDIS_SWIZZLE_MODE_BBBB:
      if (buffer->is_token_list == '\0') {
        uVar2 = ZydisStringAppendShortCase
                          (&buffer->string,&STR_DECO_BBBB,formatter->case_decorators);
      }
      else {
        uVar2 = ZydisFormatterBufferAppendPredefined
                          (buffer,(ZydisPredefinedToken *)&TOK_DATA_DECO_BBBB);
      }
      break;
    case ZYDIS_SWIZZLE_MODE_CCCC:
      if (buffer->is_token_list == '\0') {
        uVar2 = ZydisStringAppendShortCase
                          (&buffer->string,&STR_DECO_CCCC,formatter->case_decorators);
      }
      else {
        uVar2 = ZydisFormatterBufferAppendPredefined
                          (buffer,(ZydisPredefinedToken *)&TOK_DATA_DECO_CCCC);
      }
      break;
    case ZYDIS_SWIZZLE_MODE_DDDD:
      if (buffer->is_token_list == '\0') {
        uVar2 = ZydisStringAppendShortCase
                          (&buffer->string,&STR_DECO_DDDD,formatter->case_decorators);
      }
      else {
        uVar2 = ZydisFormatterBufferAppendPredefined
                          (buffer,(ZydisPredefinedToken *)&TOK_DATA_DECO_DDDD);
      }
      break;
    default:
      return 0x80100004;
    }
    break;
  case ZYDIS_DECORATOR_CONVERSION:
    switch((context->instruction->avx).conversion.mode) {
    case ZYDIS_CONVERSION_MODE_INVALID:
      return 0x100000;
    case ZYDIS_CONVERSION_MODE_FLOAT16:
      if (buffer->is_token_list == '\0') {
        uVar2 = ZydisStringAppendShortCase
                          (&buffer->string,&STR_DECO_FLOAT16,formatter->case_decorators);
      }
      else {
        uVar2 = ZydisFormatterBufferAppendPredefined
                          (buffer,(ZydisPredefinedToken *)&TOK_DATA_DECO_FLOAT16);
      }
      break;
    case ZYDIS_CONVERSION_MODE_SINT8:
      if (buffer->is_token_list == '\0') {
        uVar2 = ZydisStringAppendShortCase
                          (&buffer->string,&STR_DECO_SINT8,formatter->case_decorators);
      }
      else {
        uVar2 = ZydisFormatterBufferAppendPredefined
                          (buffer,(ZydisPredefinedToken *)&TOK_DATA_DECO_SINT8);
      }
      break;
    case ZYDIS_CONVERSION_MODE_REQUIRED_BITS:
      if (buffer->is_token_list == '\0') {
        uVar2 = ZydisStringAppendShortCase
                          (&buffer->string,&STR_DECO_UINT8,formatter->case_decorators);
      }
      else {
        uVar2 = ZydisFormatterBufferAppendPredefined
                          (buffer,(ZydisPredefinedToken *)&TOK_DATA_DECO_UINT8);
      }
      break;
    case ZYDIS_CONVERSION_MODE_SINT16:
      if (buffer->is_token_list == '\0') {
        uVar2 = ZydisStringAppendShortCase
                          (&buffer->string,&STR_DECO_SINT16,formatter->case_decorators);
      }
      else {
        uVar2 = ZydisFormatterBufferAppendPredefined
                          (buffer,(ZydisPredefinedToken *)&TOK_DATA_DECO_SINT16);
      }
      break;
    case ZYDIS_CONVERSION_MODE_MAX_VALUE:
      if (buffer->is_token_list == '\0') {
        uVar2 = ZydisStringAppendShortCase
                          (&buffer->string,&STR_DECO_UINT16,formatter->case_decorators);
      }
      else {
        uVar2 = ZydisFormatterBufferAppendPredefined
                          (buffer,(ZydisPredefinedToken *)&TOK_DATA_DECO_UINT16);
      }
      break;
    default:
      return 0x80100004;
    }
    break;
  case ZYDIS_DECORATOR_EH:
    if ((context->instruction->avx).has_eviction_hint == '\0') {
      return 0x100000;
    }
    if (buffer->is_token_list == '\0') {
      uVar2 = ZydisStringAppendShortCase(&buffer->string,&STR_DECO_EH,formatter->case_decorators);
    }
    else {
      uVar2 = ZydisFormatterBufferAppendPredefined(buffer,(ZydisPredefinedToken *)&TOK_DATA_DECO_EH)
      ;
    }
    break;
  default:
    return 0x80100004;
  }
  if ((uVar2 & 0x80000000) == 0) {
    return 0x100000;
  }
  return uVar2;
}

Assistant:

ZyanStatus ZydisFormatterBasePrintDecorator(const ZydisFormatter* formatter,
    ZydisFormatterBuffer* buffer, ZydisFormatterContext* context, ZydisDecorator decorator)
{
    ZYAN_ASSERT(formatter);
    ZYAN_ASSERT(buffer);
    ZYAN_ASSERT(context);

#if defined(ZYDIS_DISABLE_AVX512) && defined(ZYDIS_DISABLE_KNC)
    ZYAN_UNUSED(formatter);
    ZYAN_UNUSED(buffer);
    ZYAN_UNUSED(context);
#endif

    switch (decorator)
    {
    case ZYDIS_DECORATOR_MASK:
    {
#if !defined(ZYDIS_DISABLE_AVX512) || !defined(ZYDIS_DISABLE_KNC)
        if (context->instruction->avx.mask.reg != ZYDIS_REGISTER_K0)
        {
            if (buffer->is_token_list)
            {
                ZYDIS_BUFFER_APPEND(buffer, DECO_BEGIN);
                ZYAN_CHECK(formatter->func_print_register(formatter, buffer, context,
                    context->instruction->avx.mask.reg));
                ZYDIS_BUFFER_APPEND(buffer, DECO_END);
            } else
            {
                ZYAN_CHECK(ZydisStringAppendShort(&buffer->string, &STR_DECO_BEGIN));
                ZYAN_CHECK(formatter->func_print_register(formatter, buffer, context,
                    context->instruction->avx.mask.reg));
                ZYAN_CHECK(ZydisStringAppendShort(&buffer->string, &STR_DECO_END));
            }

            // Only print the zeroing decorator, if the instruction is not a "zeroing masking only"
            // instruction (e.g. `vcmpsd`)
            if ((context->instruction->avx.mask.mode == ZYDIS_MASK_MODE_ZEROING ||
                 context->instruction->avx.mask.mode == ZYDIS_MASK_MODE_CONTROL_ZEROING) &&
                (context->instruction->raw.evex.z))
            {
                ZYDIS_BUFFER_APPEND_CASE(buffer, DECO_ZERO, formatter->case_decorators);
            }
        }
#endif
        break;
    }
    case ZYDIS_DECORATOR_BC:
#if !defined(ZYDIS_DISABLE_AVX512)
        if (!context->instruction->avx.broadcast.is_static)
        {
            switch (context->instruction->avx.broadcast.mode)
            {
            case ZYDIS_BROADCAST_MODE_INVALID:
                break;
            case ZYDIS_BROADCAST_MODE_1_TO_2:
                ZYDIS_BUFFER_APPEND_CASE(buffer, DECO_1TO2, formatter->case_decorators);
                break;
            case ZYDIS_BROADCAST_MODE_1_TO_4:
                ZYDIS_BUFFER_APPEND_CASE(buffer, DECO_1TO4, formatter->case_decorators);
                break;
            case ZYDIS_BROADCAST_MODE_1_TO_8:
                ZYDIS_BUFFER_APPEND_CASE(buffer, DECO_1TO8, formatter->case_decorators);
                break;
            case ZYDIS_BROADCAST_MODE_1_TO_16:
                ZYDIS_BUFFER_APPEND_CASE(buffer, DECO_1TO16, formatter->case_decorators);
                break;
            case ZYDIS_BROADCAST_MODE_1_TO_32:
                ZYDIS_BUFFER_APPEND_CASE(buffer, DECO_1TO32, formatter->case_decorators);
                break;
            case ZYDIS_BROADCAST_MODE_1_TO_64:
                ZYDIS_BUFFER_APPEND_CASE(buffer, DECO_1TO64, formatter->case_decorators);
                break;
            case ZYDIS_BROADCAST_MODE_4_TO_8:
                ZYDIS_BUFFER_APPEND_CASE(buffer, DECO_4TO8, formatter->case_decorators);
                break;
            case ZYDIS_BROADCAST_MODE_4_TO_16:
                ZYDIS_BUFFER_APPEND_CASE(buffer, DECO_4TO16, formatter->case_decorators);
                break;
            case ZYDIS_BROADCAST_MODE_8_TO_16:
                ZYDIS_BUFFER_APPEND_CASE(buffer, DECO_8TO16, formatter->case_decorators);
                break;
            default:
                return ZYAN_STATUS_INVALID_ARGUMENT;
            }
        }
#endif
        break;
    case ZYDIS_DECORATOR_RC:
#if !defined(ZYDIS_DISABLE_AVX512)
        if (context->instruction->avx.has_sae)
        {
            switch (context->instruction->avx.rounding.mode)
            {
            case ZYDIS_ROUNDING_MODE_INVALID:
                break;
            case ZYDIS_ROUNDING_MODE_RN:
                ZYDIS_BUFFER_APPEND_CASE(buffer, DECO_RN_SAE, formatter->case_decorators);
                break;
            case ZYDIS_ROUNDING_MODE_RD:
                ZYDIS_BUFFER_APPEND_CASE(buffer, DECO_RD_SAE, formatter->case_decorators);
                break;
            case ZYDIS_ROUNDING_MODE_RU:
                ZYDIS_BUFFER_APPEND_CASE(buffer, DECO_RU_SAE, formatter->case_decorators);
                break;
            case ZYDIS_ROUNDING_MODE_RZ:
                ZYDIS_BUFFER_APPEND_CASE(buffer, DECO_RZ_SAE, formatter->case_decorators);
                break;
            default:
                return ZYAN_STATUS_INVALID_ARGUMENT;
            }
        } else
        {
            switch (context->instruction->avx.rounding.mode)
            {
            case ZYDIS_ROUNDING_MODE_INVALID:
                break;
            case ZYDIS_ROUNDING_MODE_RN:
                ZYDIS_BUFFER_APPEND_CASE(buffer, DECO_RN, formatter->case_decorators);
                break;
            case ZYDIS_ROUNDING_MODE_RD:
                ZYDIS_BUFFER_APPEND_CASE(buffer, DECO_RD, formatter->case_decorators);
                break;
            case ZYDIS_ROUNDING_MODE_RU:
                ZYDIS_BUFFER_APPEND_CASE(buffer, DECO_RU, formatter->case_decorators);
                break;
            case ZYDIS_ROUNDING_MODE_RZ:
                ZYDIS_BUFFER_APPEND_CASE(buffer, DECO_RZ, formatter->case_decorators);
                break;
            default:
                return ZYAN_STATUS_INVALID_ARGUMENT;
            }
        }
#endif
        break;
    case ZYDIS_DECORATOR_SAE:
#if !defined(ZYDIS_DISABLE_AVX512)
        if (context->instruction->avx.has_sae && !context->instruction->avx.rounding.mode)
        {
            ZYDIS_BUFFER_APPEND_CASE(buffer, DECO_SAE, formatter->case_decorators);
        }
#endif
        break;
    case ZYDIS_DECORATOR_SWIZZLE:
#if !defined(ZYDIS_DISABLE_KNC)
        switch (context->instruction->avx.swizzle.mode)
        {
        case ZYDIS_SWIZZLE_MODE_INVALID:
        case ZYDIS_SWIZZLE_MODE_DCBA:
            // Nothing to do here
            break;
        case ZYDIS_SWIZZLE_MODE_CDAB:
            ZYDIS_BUFFER_APPEND_CASE(buffer, DECO_CDAB, formatter->case_decorators);
            break;
        case ZYDIS_SWIZZLE_MODE_BADC:
            ZYDIS_BUFFER_APPEND_CASE(buffer, DECO_BADC, formatter->case_decorators);
            break;
        case ZYDIS_SWIZZLE_MODE_DACB:
            ZYDIS_BUFFER_APPEND_CASE(buffer, DECO_DACB, formatter->case_decorators);
            break;
        case ZYDIS_SWIZZLE_MODE_AAAA:
            ZYDIS_BUFFER_APPEND_CASE(buffer, DECO_AAAA, formatter->case_decorators);
            break;
        case ZYDIS_SWIZZLE_MODE_BBBB:
            ZYDIS_BUFFER_APPEND_CASE(buffer, DECO_BBBB, formatter->case_decorators);
            break;
        case ZYDIS_SWIZZLE_MODE_CCCC:
            ZYDIS_BUFFER_APPEND_CASE(buffer, DECO_CCCC, formatter->case_decorators);
            break;
        case ZYDIS_SWIZZLE_MODE_DDDD:
            ZYDIS_BUFFER_APPEND_CASE(buffer, DECO_DDDD, formatter->case_decorators);
            break;
        default:
            return ZYAN_STATUS_INVALID_ARGUMENT;
        }
#endif
        break;
    case ZYDIS_DECORATOR_CONVERSION:
#if !defined(ZYDIS_DISABLE_KNC)
        switch (context->instruction->avx.conversion.mode)
        {
        case ZYDIS_CONVERSION_MODE_INVALID:
            break;
        case ZYDIS_CONVERSION_MODE_FLOAT16:
            ZYDIS_BUFFER_APPEND_CASE(buffer, DECO_FLOAT16, formatter->case_decorators);
            break;
        case ZYDIS_CONVERSION_MODE_SINT8:
            ZYDIS_BUFFER_APPEND_CASE(buffer, DECO_SINT8, formatter->case_decorators);
            break;
        case ZYDIS_CONVERSION_MODE_UINT8:
            ZYDIS_BUFFER_APPEND_CASE(buffer, DECO_UINT8, formatter->case_decorators);
            break;
        case ZYDIS_CONVERSION_MODE_SINT16:
            ZYDIS_BUFFER_APPEND_CASE(buffer, DECO_SINT16, formatter->case_decorators);
            break;
        case ZYDIS_CONVERSION_MODE_UINT16:
            ZYDIS_BUFFER_APPEND_CASE(buffer, DECO_UINT16, formatter->case_decorators);
            break;
        default:
            return ZYAN_STATUS_INVALID_ARGUMENT;
        }
#endif
        break;
    case ZYDIS_DECORATOR_EH:
#if !defined(ZYDIS_DISABLE_KNC)
        if (context->instruction->avx.has_eviction_hint)
        {
            ZYDIS_BUFFER_APPEND_CASE(buffer, DECO_EH, formatter->case_decorators);
        }
#endif
        break;
    default:
        return ZYAN_STATUS_INVALID_ARGUMENT;
    }

    return ZYAN_STATUS_SUCCESS;
}